

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.cpp
# Opt level: O0

SRes crnlib::Flush(CLzmaEnc *p,UInt32 nowPos)

{
  SRes SVar1;
  UInt32 nowPos_local;
  CLzmaEnc *p_local;
  
  p->finished = 1;
  if (p->writeEndMark != 0) {
    WriteEndMarker(p,nowPos & p->pbMask);
  }
  RangeEnc_FlushData(&p->rc);
  RangeEnc_FlushStream(&p->rc);
  SVar1 = CheckErrors(p);
  return SVar1;
}

Assistant:

static SRes Flush(CLzmaEnc* p, UInt32 nowPos) {
  /* ReleaseMFStream(); */
  p->finished = True;
  if (p->writeEndMark)
    WriteEndMarker(p, nowPos & p->pbMask);
  RangeEnc_FlushData(&p->rc);
  RangeEnc_FlushStream(&p->rc);
  return CheckErrors(p);
}